

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O1

bool CoreML::Specification::GLMClassifier_ClassEncoding_Parse
               (ConstStringParam name,GLMClassifier_ClassEncoding *value)

{
  pointer size;
  char *size_00;
  bool bVar1;
  int *in_R9;
  StringPiece name_00;
  int int_value;
  GLMClassifier_ClassEncoding local_1c;
  
  size = (name->_M_dataplus)._M_p;
  size_00 = (char *)name->_M_string_length;
  if ((long)size_00 < 0) {
    google::protobuf::stringpiece_internal::StringPiece::LogFatalSizeTooBig
              ((size_t)size_00,"string length exceeds max size");
  }
  name_00.length_ = (size_type)&local_1c;
  name_00.ptr_ = size_00;
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    ((internal *)GLMClassifier_ClassEncoding_entries,(EnumEntry *)0x2,(size_t)size,
                     name_00,in_R9);
  if (bVar1) {
    *value = local_1c;
  }
  return bVar1;
}

Assistant:

bool GLMClassifier_ClassEncoding_Parse(
    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, GLMClassifier_ClassEncoding* value) {
  int int_value;
  bool success = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumValue(
      GLMClassifier_ClassEncoding_entries, 2, name, &int_value);
  if (success) {
    *value = static_cast<GLMClassifier_ClassEncoding>(int_value);
  }
  return success;
}